

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::builtins::ArrayUniqueMethod::eval
          (ArrayUniqueMethod *this,EvalContext *context,Args *args,SourceRange param_4,
          SystemCallInfo *callInfo)

{
  bool bVar1;
  undefined1 uVar2;
  ConstantValue *pCVar3;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RCX;
  long in_RSI;
  ConstantValue *in_RDI;
  CVIterator<false> it_1;
  flat_hash_set<ConstantValue> seen_1;
  uint32_t index_1;
  ConstantValue cv;
  CVIterator<false> it;
  flat_hash_set<ConstantValue> seen;
  uint32_t index;
  ConstantValue *iterVal;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_ast_EvalContext_h:113:13)>
  guard;
  type *iterVar;
  type *iterExpr;
  SVQueue result;
  ConstantValue arr;
  locator loc_1;
  size_t pos0_1;
  size_t hash_1;
  ConstantValue *k_1;
  locator loc;
  size_t pos0;
  size_t hash;
  ConstantValue *k;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  uint n_1;
  value_type *p_1;
  value_type *elements_1;
  int mask_1;
  group_type *pg_1;
  size_t pos_1;
  prober pb_1;
  undefined7 in_stack_fffffffffffff9a8;
  undefined1 in_stack_fffffffffffff9af;
  EvalContext *in_stack_fffffffffffff9b0;
  SVQueue *in_stack_fffffffffffff9b8;
  undefined6 in_stack_fffffffffffff9c0;
  undefined1 in_stack_fffffffffffff9c6;
  undefined1 in_stack_fffffffffffff9c7;
  equal_to<slang::ConstantValue> *in_stack_fffffffffffff9c8;
  table_core<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
  *in_stack_fffffffffffff9d0;
  undefined4 in_stack_fffffffffffff9e0;
  undefined4 in_stack_fffffffffffff9e4;
  ValueSymbol *in_stack_fffffffffffff9e8;
  undefined1 *puVar4;
  EvalContext *in_stack_fffffffffffff9f0;
  EvalContext *in_stack_fffffffffffffa08;
  ConstantValue *in_stack_fffffffffffffa10;
  undefined7 in_stack_fffffffffffffa18;
  undefined1 in_stack_fffffffffffffa1f;
  table_core<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
  *in_stack_fffffffffffffa20;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
  local_510 [4];
  undefined1 local_4a8 [32];
  ulong local_488;
  ulong local_480;
  int local_474;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
  local_460;
  undefined1 local_448 [120];
  undefined1 local_3d0 [8];
  size_t local_3c8;
  ulong local_3b0;
  ulong local_3a8;
  int local_39c;
  ConstantValue *local_370;
  type *local_350;
  type *local_348;
  pair<const_slang::ast::Expression_*,_const_slang::ast::ValueSymbol_*> local_340;
  undefined4 local_2d8;
  ConstantValue *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  ConstantValue *local_240;
  undefined1 *local_238;
  bool local_229 [25];
  iterator local_210;
  bool local_1f9 [25];
  iterator local_1e0;
  bool local_1c9;
  iterator local_1c8;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_slang::ConstantValue>
  local_1b8;
  size_t local_1a0;
  size_t local_198;
  table_core<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
  *local_190;
  ConstantValue *local_188;
  undefined1 *local_180;
  bool local_171 [25];
  iterator local_158;
  bool local_141 [25];
  iterator local_128;
  bool local_111;
  iterator local_110;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_slang::ConstantValue>
  local_100;
  size_t local_e8;
  size_t local_e0;
  ConstantValue *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  uint local_bc;
  value_type *local_b8;
  value_type *local_b0;
  uint local_a4;
  group_type *local_a0;
  size_t local_98;
  pow2_quadratic_prober local_90;
  size_t local_80;
  size_t local_78;
  ConstantValue *local_70;
  undefined1 *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  table_core<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
  *local_10;
  undefined1 *local_8;
  
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,0);
  Expression::eval((Expression *)in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0);
  bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x9063b0);
  if (bVar1) {
    SVQueue::SVQueue((SVQueue *)in_stack_fffffffffffff9b0);
    local_340 = CallExpression::SystemCallInfo::getIteratorInfo
                          ((SystemCallInfo *)
                           CONCAT17(in_stack_fffffffffffff9c7,
                                    CONCAT16(in_stack_fffffffffffff9c6,in_stack_fffffffffffff9c0)));
    local_348 = std::get<0ul,slang::ast::Expression_const*,slang::ast::ValueSymbol_const*>
                          ((pair<const_slang::ast::Expression_*,_const_slang::ast::ValueSymbol_*> *)
                           0x90645d);
    local_350 = std::get<1ul,slang::ast::Expression_const*,slang::ast::ValueSymbol_const*>
                          ((pair<const_slang::ast::Expression_*,_const_slang::ast::ValueSymbol_*> *)
                           0x906472);
    if (*local_348 == (type)0x0) {
      local_474 = 0;
      boost::unordered::
      unordered_flat_set<slang::ConstantValue,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
      ::unordered_flat_set
                ((unordered_flat_set<slang::ConstantValue,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
                  *)in_stack_fffffffffffff9d0);
      begin<slang::ConstantValue,_false>((ConstantValue *)in_stack_fffffffffffff9b8);
      while( true ) {
        end<slang::ConstantValue,_false>((ConstantValue *)in_stack_fffffffffffff9b8);
        uVar2 = operator==<slang::CVIterator<false>_>
                          ((self_type *)in_stack_fffffffffffff9b0,
                           (CVIterator<false> *)
                           CONCAT17(in_stack_fffffffffffff9af,in_stack_fffffffffffff9a8));
        if (((uVar2 ^ 0xff) & 1) == 0) break;
        pCVar3 = iterator_facade<slang::CVIterator<false>,_false>::operator*
                           ((iterator_facade<slang::CVIterator<false>,_false> *)0x906d66);
        puVar4 = local_4a8;
        local_270 = pCVar3;
        local_268 = puVar4;
        local_240 = pCVar3;
        local_238 = puVar4;
        local_188 = pCVar3;
        local_180 = puVar4;
        local_190 = (table_core<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
                     *)boost::unordered::detail::foa::
                       table_core<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
                       ::key_from<slang::ConstantValue>((ConstantValue *)0x906de4);
        local_198 = boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
                    ::hash_for<slang::ConstantValue>
                              ((table_core<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
                                *)in_stack_fffffffffffff9b0,
                               (ConstantValue *)
                               CONCAT17(in_stack_fffffffffffff9af,in_stack_fffffffffffff9a8));
        local_1a0 = boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
                    ::position_for((table_core<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
                                    *)in_stack_fffffffffffff9b0,
                                   CONCAT17(in_stack_fffffffffffff9af,in_stack_fffffffffffff9a8));
        local_10 = local_190;
        local_20 = local_198;
        local_18 = local_1a0;
        local_8 = puVar4;
        boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                  (&local_30,local_1a0);
        do {
          local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
          local_40 = boost::unordered::detail::foa::
                     table_arrays<slang::ConstantValue,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<slang::ConstantValue>_>
                     ::groups((table_arrays<slang::ConstantValue,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<slang::ConstantValue>_>
                               *)0x906ec2);
          local_40 = local_40 + local_38;
          local_44 = boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::match
                               ((group15<boost::unordered::detail::foa::plain_integral> *)
                                in_stack_fffffffffffff9b8,(size_t)in_stack_fffffffffffff9b0);
          if (local_44 != 0) {
            local_50 = boost::unordered::detail::foa::
                       table_arrays<slang::ConstantValue,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<slang::ConstantValue>_>
                       ::elements((table_arrays<slang::ConstantValue,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<slang::ConstantValue>_>
                                   *)0x906f17);
            local_58 = local_50 + local_38 * 0xf;
            do {
              local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
              in_stack_fffffffffffff9c8 =
                   boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
                   ::pred((table_core<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
                           *)0x906f67);
              in_stack_fffffffffffff9d0 = local_10;
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
              ::key_from<slang::ConstantValue>((ConstantValue *)0x906f95);
              in_stack_fffffffffffff9c7 =
                   std::equal_to<slang::ConstantValue>::operator()
                             ((equal_to<slang::ConstantValue> *)in_stack_fffffffffffff9b0,
                              (ConstantValue *)
                              CONCAT17(in_stack_fffffffffffff9af,in_stack_fffffffffffff9a8),
                              (ConstantValue *)0x906fb0);
              if ((bool)in_stack_fffffffffffff9c7) {
                boost::unordered::detail::foa::
                table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_slang::ConstantValue>
                ::table_locator(&local_1b8,local_40,local_5c,local_58 + local_5c);
                goto LAB_009070a6;
              }
              local_44 = local_44 - 1 & local_44;
            } while (local_44 != 0);
          }
          in_stack_fffffffffffff9c6 =
               boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                                   in_stack_fffffffffffff9b0,
                                   CONCAT17(in_stack_fffffffffffff9af,in_stack_fffffffffffff9a8));
          if ((bool)in_stack_fffffffffffff9c6) {
            memset(&local_1b8,0,0x18);
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_slang::ConstantValue>
            ::table_locator(&local_1b8);
            goto LAB_009070a6;
          }
          bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                            (&local_30,*(size_t *)(puVar4 + 8));
        } while (bVar1);
        memset(&local_1b8,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_slang::ConstantValue>
        ::table_locator(&local_1b8);
LAB_009070a6:
        bVar1 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                          ((table_locator *)&local_1b8);
        if (bVar1) {
          local_1c8 = boost::unordered::detail::foa::
                      table<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
                      ::make_iterator((locator *)0x9070c8);
          local_1c9 = false;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                    (local_510,&local_1c8,&local_1c9);
        }
        else if (local_480 < local_488) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ConstantValue,void>,std::equal_to<slang::ConstantValue>,std::allocator<slang::ConstantValue>>
          ::unchecked_emplace_at<slang::ConstantValue&>
                    (in_stack_fffffffffffff9d0,(size_t)in_stack_fffffffffffff9c8,
                     CONCAT17(in_stack_fffffffffffff9c7,
                              CONCAT16(in_stack_fffffffffffff9c6,in_stack_fffffffffffff9c0)),
                     (ConstantValue *)in_stack_fffffffffffff9b8);
          local_1e0 = boost::unordered::detail::foa::
                      table<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
                      ::make_iterator((locator *)0x90714a);
          local_1f9[0] = true;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                    (local_510,&local_1e0,local_1f9);
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ConstantValue,void>,std::equal_to<slang::ConstantValue>,std::allocator<slang::ConstantValue>>
          ::unchecked_emplace_with_rehash<slang::ConstantValue&>
                    (in_stack_fffffffffffffa20,CONCAT17(uVar2,in_stack_fffffffffffffa18),pCVar3);
          local_210 = boost::unordered::detail::foa::
                      table<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
                      ::make_iterator((locator *)0x9071b2);
          local_229[0] = true;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                    (local_510,&local_210,local_229);
        }
        if ((local_510[0].second & 1U) != 0) {
          if ((*(byte *)(in_RSI + 0x38) & 1) != 0) {
            bVar1 = slang::ConstantValue::isMap((ConstantValue *)0x90721a);
            if (!bVar1) {
              SVInt::SVInt((SVInt *)CONCAT17(in_stack_fffffffffffff9c7,
                                             CONCAT16(in_stack_fffffffffffff9c6,
                                                      in_stack_fffffffffffff9c0)),
                           (bitwidth_t)((ulong)in_stack_fffffffffffff9b8 >> 0x20),
                           (uint64_t)in_stack_fffffffffffff9b0,(bool)in_stack_fffffffffffff9af);
              std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::
              emplace_back<slang::SVInt>
                        ((deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                         in_stack_fffffffffffff9b0,
                         (SVInt *)CONCAT17(in_stack_fffffffffffff9af,in_stack_fffffffffffff9a8));
              SVInt::~SVInt((SVInt *)CONCAT17(in_stack_fffffffffffff9c7,
                                              CONCAT16(in_stack_fffffffffffff9c6,
                                                       in_stack_fffffffffffff9c0)));
              goto LAB_00907312;
            }
          }
          if ((*(byte *)(in_RSI + 0x38) & 1) == 0) {
            in_stack_fffffffffffff9b0 =
                 (EvalContext *)
                 iterator_facade<slang::CVIterator<false>,_false>::operator*
                           ((iterator_facade<slang::CVIterator<false>,_false> *)0x9072f1);
            std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::
            emplace_back<slang::ConstantValue>
                      ((deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                       in_stack_fffffffffffff9b0,
                       (ConstantValue *)
                       CONCAT17(in_stack_fffffffffffff9af,in_stack_fffffffffffff9a8));
          }
          else {
            in_stack_fffffffffffff9b8 =
                 (SVQueue *)CVIterator<false>::key((CVIterator<false> *)in_stack_fffffffffffff9b0);
            std::deque<slang::ConstantValue,std::allocator<slang::ConstantValue>>::
            emplace_back<slang::ConstantValue_const&>
                      ((deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                       in_stack_fffffffffffff9b0,
                       (ConstantValue *)
                       CONCAT17(in_stack_fffffffffffff9af,in_stack_fffffffffffff9a8));
          }
        }
LAB_00907312:
        iterator_facade<slang::CVIterator<false>,_false>::operator++<slang::CVIterator<false>_>
                  ((iterator_facade<slang::CVIterator<false>,_false> *)in_stack_fffffffffffff9b0);
        local_474 = local_474 + 1;
      }
      boost::unordered::
      unordered_flat_set<slang::ConstantValue,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
      ::~unordered_flat_set
                ((unordered_flat_set<slang::ConstantValue,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
                  *)0x907346);
    }
    else {
      EvalContext::disableCaching(in_stack_fffffffffffffa08);
      slang::ConstantValue::ConstantValue
                ((ConstantValue *)in_stack_fffffffffffff9b0,
                 (nullptr_t)CONCAT17(in_stack_fffffffffffff9af,in_stack_fffffffffffff9a8));
      pCVar3 = EvalContext::createLocal
                         (in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,
                          (ConstantValue *)
                          CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0));
      slang::ConstantValue::~ConstantValue((ConstantValue *)0x906513);
      local_39c = 0;
      local_370 = pCVar3;
      boost::unordered::
      unordered_flat_set<slang::ConstantValue,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
      ::unordered_flat_set
                ((unordered_flat_set<slang::ConstantValue,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
                  *)in_stack_fffffffffffff9d0);
      begin<slang::ConstantValue,_false>((ConstantValue *)in_stack_fffffffffffff9b8);
      while( true ) {
        end<slang::ConstantValue,_false>((ConstantValue *)in_stack_fffffffffffff9b8);
        bVar1 = operator==<slang::CVIterator<false>_>
                          ((self_type *)in_stack_fffffffffffff9b0,
                           (CVIterator<false> *)
                           CONCAT17(in_stack_fffffffffffff9af,in_stack_fffffffffffff9a8));
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        iterator_facade<slang::CVIterator<false>,_false>::operator*
                  ((iterator_facade<slang::CVIterator<false>,_false> *)0x9065aa);
        slang::ConstantValue::operator=
                  ((ConstantValue *)in_stack_fffffffffffff9b0,
                   (ConstantValue *)CONCAT17(in_stack_fffffffffffff9af,in_stack_fffffffffffff9a8));
        Expression::eval((Expression *)in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0);
        local_260 = local_448;
        local_258 = local_3d0;
        local_250 = local_260;
        local_248 = local_3d0;
        local_d0 = local_260;
        local_c8 = local_3d0;
        local_d8 = boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
                   ::key_from<slang::ConstantValue>((ConstantValue *)0x90666a);
        local_e0 = boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
                   ::hash_for<slang::ConstantValue>
                             ((table_core<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
                               *)in_stack_fffffffffffff9b0,
                              (ConstantValue *)
                              CONCAT17(in_stack_fffffffffffff9af,in_stack_fffffffffffff9a8));
        local_e8 = boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
                   ::position_for((table_core<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
                                   *)in_stack_fffffffffffff9b0,
                                  CONCAT17(in_stack_fffffffffffff9af,in_stack_fffffffffffff9a8));
        local_70 = local_d8;
        local_80 = local_e0;
        local_78 = local_e8;
        local_68 = local_3d0;
        boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                  (&local_90,local_e8);
        do {
          local_98 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_90);
          local_a0 = boost::unordered::detail::foa::
                     table_arrays<slang::ConstantValue,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<slang::ConstantValue>_>
                     ::groups((table_arrays<slang::ConstantValue,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<slang::ConstantValue>_>
                               *)0x906769);
          local_a0 = local_a0 + local_98;
          local_a4 = boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::match
                               ((group15<boost::unordered::detail::foa::plain_integral> *)
                                in_stack_fffffffffffff9b8,(size_t)in_stack_fffffffffffff9b0);
          if (local_a4 != 0) {
            local_b0 = boost::unordered::detail::foa::
                       table_arrays<slang::ConstantValue,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<slang::ConstantValue>_>
                       ::elements((table_arrays<slang::ConstantValue,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<slang::ConstantValue>_>
                                   *)0x9067c7);
            local_b8 = local_b0 + local_98 * 0xf;
            do {
              local_bc = boost::unordered::detail::foa::unchecked_countr_zero(0);
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
              ::pred((table_core<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
                      *)0x90681a);
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
              ::key_from<slang::ConstantValue>((ConstantValue *)0x90684e);
              bVar1 = std::equal_to<slang::ConstantValue>::operator()
                                ((equal_to<slang::ConstantValue> *)in_stack_fffffffffffff9b0,
                                 (ConstantValue *)
                                 CONCAT17(in_stack_fffffffffffff9af,in_stack_fffffffffffff9a8),
                                 (ConstantValue *)0x906875);
              if (bVar1) {
                boost::unordered::detail::foa::
                table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_slang::ConstantValue>
                ::table_locator(&local_100,local_a0,local_bc,local_b8 + local_bc);
                goto LAB_0090697a;
              }
              local_a4 = local_a4 - 1 & local_a4;
            } while (local_a4 != 0);
          }
          bVar1 = boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                            ((group15<boost::unordered::detail::foa::plain_integral> *)
                             in_stack_fffffffffffff9b0,
                             CONCAT17(in_stack_fffffffffffff9af,in_stack_fffffffffffff9a8));
          if (bVar1) {
            memset(&local_100,0,0x18);
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_slang::ConstantValue>
            ::table_locator(&local_100);
            goto LAB_0090697a;
          }
          bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next(&local_90,local_3c8);
        } while (bVar1);
        memset(&local_100,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_slang::ConstantValue>
        ::table_locator(&local_100);
LAB_0090697a:
        bVar1 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                          ((table_locator *)&local_100);
        if (bVar1) {
          local_110 = boost::unordered::detail::foa::
                      table<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
                      ::make_iterator((locator *)0x90699c);
          local_111 = false;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                    (&local_460,&local_110,&local_111);
        }
        else if (local_3a8 < local_3b0) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ConstantValue,void>,std::equal_to<slang::ConstantValue>,std::allocator<slang::ConstantValue>>
          ::unchecked_emplace_at<slang::ConstantValue&>
                    (in_stack_fffffffffffff9d0,(size_t)in_stack_fffffffffffff9c8,
                     CONCAT17(in_stack_fffffffffffff9c7,
                              CONCAT16(in_stack_fffffffffffff9c6,in_stack_fffffffffffff9c0)),
                     (ConstantValue *)in_stack_fffffffffffff9b8);
          local_128 = boost::unordered::detail::foa::
                      table<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
                      ::make_iterator((locator *)0x906a24);
          local_141[0] = true;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                    (&local_460,&local_128,local_141);
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ConstantValue,void>,std::equal_to<slang::ConstantValue>,std::allocator<slang::ConstantValue>>
          ::unchecked_emplace_with_rehash<slang::ConstantValue&>
                    (in_stack_fffffffffffffa20,
                     CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18),
                     in_stack_fffffffffffffa10);
          local_158 = boost::unordered::detail::foa::
                      table<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
                      ::make_iterator((locator *)0x906a8f);
          local_171[0] = true;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                    (&local_460,&local_158,local_171);
        }
        if ((local_460.second & 1U) != 0) {
          if ((*(byte *)(in_RSI + 0x38) & 1) != 0) {
            bVar1 = slang::ConstantValue::isMap((ConstantValue *)0x906af7);
            if (!bVar1) {
              SVInt::SVInt((SVInt *)CONCAT17(in_stack_fffffffffffff9c7,
                                             CONCAT16(in_stack_fffffffffffff9c6,
                                                      in_stack_fffffffffffff9c0)),
                           (bitwidth_t)((ulong)in_stack_fffffffffffff9b8 >> 0x20),
                           (uint64_t)in_stack_fffffffffffff9b0,(bool)in_stack_fffffffffffff9af);
              std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::
              emplace_back<slang::SVInt>
                        ((deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                         in_stack_fffffffffffff9b0,
                         (SVInt *)CONCAT17(in_stack_fffffffffffff9af,in_stack_fffffffffffff9a8));
              SVInt::~SVInt((SVInt *)CONCAT17(in_stack_fffffffffffff9c7,
                                              CONCAT16(in_stack_fffffffffffff9c6,
                                                       in_stack_fffffffffffff9c0)));
              goto LAB_00906c66;
            }
          }
          if ((*(byte *)(in_RSI + 0x38) & 1) == 0) {
            in_stack_fffffffffffffa20 =
                 (table_core<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
                  *)iterator_facade<slang::CVIterator<false>,_false>::operator*
                              ((iterator_facade<slang::CVIterator<false>,_false> *)0x906c45);
            std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::
            emplace_back<slang::ConstantValue>
                      ((deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                       in_stack_fffffffffffff9b0,
                       (ConstantValue *)
                       CONCAT17(in_stack_fffffffffffff9af,in_stack_fffffffffffff9a8));
          }
          else {
            CVIterator<false>::key((CVIterator<false> *)in_stack_fffffffffffff9b0);
            std::deque<slang::ConstantValue,std::allocator<slang::ConstantValue>>::
            emplace_back<slang::ConstantValue_const&>
                      ((deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                       in_stack_fffffffffffff9b0,
                       (ConstantValue *)
                       CONCAT17(in_stack_fffffffffffff9af,in_stack_fffffffffffff9a8));
          }
        }
LAB_00906c66:
        slang::ConstantValue::~ConstantValue((ConstantValue *)0x906c73);
        iterator_facade<slang::CVIterator<false>,_false>::operator++<slang::CVIterator<false>_>
                  ((iterator_facade<slang::CVIterator<false>,_false> *)in_stack_fffffffffffff9b0);
        local_39c = local_39c + 1;
      }
      boost::unordered::
      unordered_flat_set<slang::ConstantValue,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
      ::~unordered_flat_set
                ((unordered_flat_set<slang::ConstantValue,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
                  *)0x906cb4);
      ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/../include/slang/ast/EvalContext.h:113:13)>
      ::~ScopeGuard((ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_ast_EvalContext_h:113:13)>
                     *)in_stack_fffffffffffff9b0);
    }
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)
               CONCAT17(in_stack_fffffffffffff9c7,
                        CONCAT16(in_stack_fffffffffffff9c6,in_stack_fffffffffffff9c0)),
               in_stack_fffffffffffff9b8);
    local_2d8 = 1;
    SVQueue::~SVQueue((SVQueue *)0x907386);
  }
  else {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_fffffffffffff9b0,
               (nullptr_t)CONCAT17(in_stack_fffffffffffff9af,in_stack_fffffffffffff9a8));
    local_2d8 = 1;
  }
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x9073a4);
  return in_RDI;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange,
                       const CallExpression::SystemCallInfo& callInfo) const final {
        ConstantValue arr = args[0]->eval(context);
        if (!arr)
            return nullptr;

        SVQueue result;

        auto [iterExpr, iterVar] = callInfo.getIteratorInfo();
        if (iterExpr) {
            SLANG_ASSERT(iterVar);
            auto guard = context.disableCaching();
            auto iterVal = context.createLocal(iterVar);

            uint32_t index = 0;
            flat_hash_set<ConstantValue> seen;
            for (auto it = begin(arr); it != end(arr); ++it, ++index) {
                *iterVal = *it;
                auto cv = iterExpr->eval(context);
                if (seen.emplace(cv).second) {
                    if (isIndexed && !arr.isMap())
                        result.emplace_back(SVInt(32, index, true));
                    else if (isIndexed)
                        result.emplace_back(it.key());
                    else
                        result.emplace_back(std::move(*it));
                }
            }
        }
        else {
            uint32_t index = 0;
            flat_hash_set<ConstantValue> seen;
            for (auto it = begin(arr); it != end(arr); ++it, ++index) {
                if (seen.emplace(*it).second) {
                    if (isIndexed && !arr.isMap())
                        result.emplace_back(SVInt(32, index, true));
                    else if (isIndexed)
                        result.emplace_back(it.key());
                    else
                        result.emplace_back(std::move(*it));
                }
            }
        }

        return result;
    }